

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_planesurface.cpp
# Opt level: O0

bool __thiscall ON_ClippingPlaneData::HasDefaultContent(ON_ClippingPlaneData *this)

{
  int iVar1;
  ON_ClippingPlaneData *this_local;
  
  if ((this->m_depth != 0.0) || (NAN(this->m_depth))) {
    this_local._7_1_ = false;
  }
  else {
    iVar1 = ON_UuidList::Count(&this->m_object_id_list);
    if (iVar1 < 1) {
      iVar1 = ON_SimpleArray<int>::Count(&this->m_layer_list);
      if (iVar1 < 1) {
        if ((this->m_is_exclusion_list & 1U) == 0) {
          this_local._7_1_ = false;
        }
        else {
          this_local._7_1_ = true;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ON_ClippingPlaneData::HasDefaultContent() const
{
  if (m_depth != 0.0)
    return false;
  
  if (m_object_id_list.Count()>0)
    return false;

  if (m_layer_list.Count() > 0)
    return false;
  
  if (!m_is_exclusion_list)
    return false;

  return true;
}